

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanorod_pentBuilderCmd.cpp
# Opt level: O3

int update_multiple_arg_temp
              (generic_list **list,uint *prev_given,char *val,char **possible_values,
              char *default_value,cmdline_parser_arg_type arg_type,char *long_opt,char short_opt,
              char *additional_error)

{
  int iVar1;
  char *value;
  char *arg;
  generic_list *field;
  char short_opt_00;
  
  value = get_multiple_arg_token(val);
  arg = get_multiple_arg_token_next(val);
  while( true ) {
    short_opt_00 = -0x4f;
    field = (generic_list *)malloc(0x18);
    field->next = *list;
    *list = field;
    (field->arg).double_arg = 0.0;
    field->orig = (char *)0x0;
    iVar1 = update_arg(field,&field->orig,(uint *)0x0,prev_given,value,(char **)0x2,(char *)0x0,
                       ARG_STRING,1,1,(int)possible_values,0x2d,default_value,short_opt_00,
                       default_value);
    if (iVar1 != 0) {
      if (value != (char *)0x0) {
        free(value);
      }
      return 1;
    }
    if (arg == (char *)0x0) break;
    value = get_multiple_arg_token(arg);
    arg = get_multiple_arg_token_next(arg);
  }
  return 0;
}

Assistant:

static
int update_multiple_arg_temp(struct generic_list **list,
               unsigned int *prev_given, const char *val,
               const char *possible_values[], const char *default_value,
               cmdline_parser_arg_type arg_type,
               const char *long_opt, char short_opt,
               const char *additional_error)
{
  /* store single arguments */
  char *multi_token;
  const char *multi_next;

  if (arg_type == ARG_NO) {
    (*prev_given)++;
    return 0; /* OK */
  }

  multi_token = get_multiple_arg_token(val);
  multi_next = get_multiple_arg_token_next (val);

  while (1)
    {
      add_node (list);
      if (update_arg((void *)&((*list)->arg), &((*list)->orig), 0,
          prev_given, multi_token, possible_values, default_value, 
          arg_type, 0, 1, 1, 1, long_opt, short_opt, additional_error)) {
        if (multi_token) free(multi_token);
        return 1; /* failure */
      }

      if (multi_next)
        {
          multi_token = get_multiple_arg_token(multi_next);
          multi_next = get_multiple_arg_token_next (multi_next);
        }
      else
        break;
    }

  return 0; /* OK */
}